

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

bool wallet::IsSQLiteFile(path *path)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  __type_conflict _Var4;
  ulong uVar5;
  CChainParams *pCVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  error_code ec;
  char app_id [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  char magic [16];
  ifstream file;
  string magic_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::exists(&path->super_path);
  if (bVar2) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar5 = std::filesystem::file_size((path *)path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      std::filesystem::__cxx11::path::string(&magic_str,&path->super_path);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "IsSQLiteFile";
      logging_function._M_len = 0xc;
      LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x7f,ALL,Info,(ConstevalFormatString<3U>)0xdf0c1c,
                 (char (*) [13])"IsSQLiteFile",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &magic_str);
      std::__cxx11::string::~string((string *)&magic_str);
      std::__cxx11::string::~string((string *)&file);
    }
    if (0x1ff < uVar5) {
      std::ifstream::ifstream<fs::path,fs::path>((ifstream *)&file,path,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        bVar2 = false;
      }
      else {
        std::istream::read((char *)&file,(long)magic);
        std::istream::seekg((long)&file,0x44);
        std::istream::read((char *)&file,(long)app_id);
        std::ifstream::close();
        magic_str._M_dataplus._M_p = (pointer)&magic_str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&magic_str,magic,&file);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"SQLite format 3","");
        _Var4 = std::operator==(&magic_str,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        if (_Var4) {
          pCVar6 = Params();
          bVar2 = *(char (*) [4])(pCVar6->pchMessageStart)._M_elems == app_id;
        }
        else {
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&magic_str);
      }
      std::ifstream::~ifstream(&file);
      goto LAB_00900212;
    }
  }
  bVar2 = false;
LAB_00900212:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSQLiteFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A SQLite Database file is at least 512 bytes.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 512) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    // Magic is at beginning and is 16 bytes long
    char magic[16];
    file.read(magic, 16);

    // Application id is at offset 68 and 4 bytes long
    file.seekg(68, std::ios::beg);
    char app_id[4];
    file.read(app_id, 4);

    file.close();

    // Check the magic, see https://sqlite.org/fileformat.html
    std::string magic_str(magic, 16);
    if (magic_str != std::string{"SQLite format 3\000", 16}) {
        return false;
    }

    // Check the application id matches our network magic
    return memcmp(Params().MessageStart().data(), app_id, 4) == 0;
}